

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getNgrams
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Dictionary *this,string *word)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int32_t i;
  uint uVar2;
  vector<int,_std::allocator<int>_> *__x;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> submorph;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> subipangram;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> subngram;
  subentry sublemma;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_a8;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_88;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_68;
  subentry local_48;
  
  uVar2 = find(this,word);
  i = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2];
  if (i < 0) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = &local_48.subword.field_2;
    local_48.subword._M_string_length = 0;
    local_48.subword.field_2._M_local_buf[0] = '\0';
    local_a8.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.subword._M_dataplus._M_p = (pointer)paVar1;
    computeNgrams(this,word,__return_storage_ptr__,&local_68,&local_48,&local_a8,&local_88);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.subword._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.subword._M_dataplus._M_p);
    }
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(&local_88);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(&local_68);
  }
  else {
    __x = getNgrams(this,i);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> Dictionary::getNgrams(const std::string& word) const {
  int32_t i = getId(word);
  if (i >= 0) {
    return getNgrams(i);
  }
  std::vector<int32_t> ngrams;
  std::vector<subentry> subngram;
  std::vector<subentry> subipangram;
  subentry sublemma;
  std::vector<subentry> submorph;
  computeNgrams(word, ngrams,subngram,sublemma,submorph,subipangram);
  return ngrams;
}